

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O1

Norm * __thiscall
icu_63::Normalizer2DataBuilder::checkNormForMapping(Normalizer2DataBuilder *this,Norm *p,UChar32 c)

{
  Norm *extraout_RAX;
  
  if (p != (Norm *)0x0) {
    if (p->mappingType != NONE) {
      if (this->overrideHandling == OVERRIDE_PREVIOUS) {
        if (p->mappingPhase == this->phase) goto LAB_001dcd43;
      }
      else if (this->overrideHandling == OVERRIDE_NONE) {
LAB_001dcd43:
        checkNormForMapping();
        this->overrideHandling = c;
        this->phase = this->phase + 1;
        return extraout_RAX;
      }
      if (p->mapping != (UnicodeString *)0x0) {
        (*(p->mapping->super_Replaceable).super_UObject._vptr_UObject[1])();
      }
      p->mapping = (UnicodeString *)0x0;
    }
    p->mappingPhase = this->phase;
  }
  return p;
}

Assistant:

Norm *Normalizer2DataBuilder::checkNormForMapping(Norm *p, UChar32 c) {
    if(p!=NULL) {
        if(p->mappingType!=Norm::NONE) {
            if( overrideHandling==OVERRIDE_NONE ||
                (overrideHandling==OVERRIDE_PREVIOUS && p->mappingPhase==phase)
            ) {
                fprintf(stderr,
                        "error in gennorm2 phase %d: "
                        "not permitted to override mapping for U+%04lX from phase %d\n",
                        (int)phase, (long)c, (int)p->mappingPhase);
                exit(U_INVALID_FORMAT_ERROR);
            }
            delete p->mapping;
            p->mapping=NULL;
        }
        p->mappingPhase=phase;
    }
    return p;
}